

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O3

void __thiscall
QCalendarWidgetPrivate::_q_slotChangeDate(QCalendarWidgetPrivate *this,QDate date,bool changeMonth)

{
  QCalendarModel *pQVar1;
  long lVar2;
  QObject *pQVar3;
  int year;
  int month;
  long lVar4;
  long in_FS_OFFSET;
  QDate local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->m_model;
  lVar2 = (pQVar1->m_date).jd;
  lVar4 = (pQVar1->m_minimumDate).jd;
  (pQVar1->m_date).jd = date.jd;
  if ((date.jd < lVar4) ||
     (lVar4 = (pQVar1->m_maximumDate).jd, local_30.jd = date.jd, lVar4 < date.jd)) {
    (pQVar1->m_date).jd = lVar4;
    local_30.jd = lVar4;
  }
  if (changeMonth) {
    year = QDate::year(&local_30,*(undefined8 *)&pQVar1->m_calendar);
    month = QDate::month(&local_30,*(undefined8 *)&this->m_model->m_calendar);
    showMonth(this,year,month);
  }
  if (lVar2 != local_30.jd) {
    update(this);
    pQVar3 = *(QObject **)&(this->super_QWidgetPrivate).field_0x8;
    (this->m_navigator->m_date).jd = local_30.jd;
    QMetaObject::activate(pQVar3,&QCalendarWidget::staticMetaObject,0,(void **)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCalendarWidgetPrivate::_q_slotChangeDate(QDate date, bool changeMonth)
{
    QDate oldDate = m_model->m_date;
    m_model->setDate(date);
    QDate newDate = m_model->m_date;
    if (changeMonth)
        showMonth(newDate.year(m_model->m_calendar), newDate.month(m_model->m_calendar));
    if (oldDate != newDate) {
        update();
        Q_Q(QCalendarWidget);
        m_navigator->setDate(newDate);
        emit q->selectionChanged();
    }
}